

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmtobj.h
# Opt level: O3

pfq_ele * __thiscall CVmObjTadsInhQueue::alloc_ele(CVmObjTadsInhQueue *this)

{
  pfq_page *ppVar1;
  pfq_ele *ppVar2;
  pfq_ele *ppVar3;
  long lVar4;
  pfq_ele *ppVar5;
  
  ppVar2 = this->free_;
  if (ppVar2 == (pfq_ele *)0x0) {
    ppVar1 = (pfq_page *)malloc(0x4b8);
    ppVar1->nxt = this->alloc_;
    this->alloc_ = ppVar1;
    lVar4 = 0;
    ppVar2 = ppVar1->eles;
    ppVar5 = (pfq_ele *)0x0;
    do {
      ppVar3 = ppVar5;
      ppVar5 = ppVar2;
      ppVar5->nxt = ppVar3;
      lVar4 = lVar4 + -0x18;
      ppVar2 = ppVar5 + 1;
    } while (lVar4 != -0x4b0);
    ppVar2 = ppVar1->eles + 0x31;
  }
  else {
    ppVar3 = ppVar2->nxt;
  }
  this->free_ = ppVar3;
  return ppVar2;
}

Assistant:

pfq_ele *alloc_ele()
    {
        pfq_ele *ele;

        /* if we have nothing in the free list, allocate more elements */
        if (free_ == 0)
        {
            pfq_page *pg;
            size_t i;

            /* allocate another page */
            pg = (pfq_page *)t3malloc(sizeof(pfq_page));

            /* link it into our master page list */
            pg->nxt = alloc_;
            alloc_ = pg;

            /* link all of its elements into the free list */
            for (ele = pg->eles, i = sizeof(pg->eles)/sizeof(pg->eles[0]) ;
                 i != 0 ; --i, ++ele)
            {
                /* link this one into the free list */
                ele->nxt = free_;
                free_ = ele;
            }
        }

        /* take the next element off the free list */
        ele = free_;
        free_ = free_->nxt;

        /* return the element */
        return ele;
    }